

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

void __thiscall QIODevicePrivate::setWriteChannelCount(QIODevicePrivate *this,int count)

{
  QVarLengthArray<QRingBuffer,_1LL> *array;
  QVLABase<QRingBuffer> *this_00;
  QRingBuffer *pQVar1;
  long sz;
  
  sz = (long)count;
  array = &this->writeBuffers;
  if ((this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s < sz) {
    if (this->writeBufferChunkSize != 0) {
      this_00 = &(this->writeBuffers).super_QVLABase<QRingBuffer>;
      if ((this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.a < sz) {
        QVLABase<QRingBuffer>::reallocate_impl
                  (this_00,1,array,
                   (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s,sz);
      }
      if ((this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s < sz) {
        do {
          QVLABase<QRingBuffer>::emplace_back_impl<int&>
                    (this_00,1,array,&this->writeBufferChunkSize);
        } while ((this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s < sz);
      }
    }
  }
  else {
    QVLABase<QRingBuffer>::resize_impl(&(this->writeBuffers).super_QVLABase<QRingBuffer>,1,array,sz)
    ;
  }
  this->writeChannelCount = count;
  pQVar1 = (QRingBuffer *)0x0;
  if ((long)this->currentWriteChannel <
      (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s) {
    pQVar1 = (QRingBuffer *)
             ((long)this->currentWriteChannel * 0x28 +
             (long)(this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr);
  }
  (this->writeBuffer).m_buf = pQVar1;
  return;
}

Assistant:

void QIODevicePrivate::setWriteChannelCount(int count)
{
    if (count > writeBuffers.size()) {
        // If writeBufferChunkSize is zero (default value), we don't use
        // QIODevice's write buffers.
        if (writeBufferChunkSize != 0) {
            writeBuffers.reserve(count);
            while (writeBuffers.size() < count)
                writeBuffers.emplace_back(writeBufferChunkSize);
        }
    } else {
        writeBuffers.resize(count);
    }
    writeChannelCount = count;
    setCurrentWriteChannel(currentWriteChannel);
}